

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata_cache.c
# Opt level: O3

edata_t * duckdb_je_edata_cache_fast_get(tsdn_t *tsdn,edata_cache_fast_t *ecs)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  atomic_zu_t *paVar3;
  edata_cache_t *peVar4;
  edata_t *peVar5;
  int iVar6;
  edata_t *peVar7;
  
  if (ecs->disabled == true) {
    peVar7 = duckdb_je_edata_cache_get(tsdn,ecs->fallback);
    return peVar7;
  }
  peVar7 = (ecs->list).head.qlh_first;
  if (peVar7 == (edata_t *)0x0) {
    peVar4 = ecs->fallback;
    iVar6 = pthread_mutex_trylock((pthread_mutex_t *)((long)&(peVar4->mtx).field_0 + 0x48));
    if (iVar6 != 0) {
      duckdb_je_malloc_mutex_lock_slow(&peVar4->mtx);
      (peVar4->mtx).field_0.field_0.locked.repr = true;
    }
    puVar1 = &(peVar4->mtx).field_0.field_0.prof_data.n_lock_ops;
    *puVar1 = *puVar1 + 1;
    if ((peVar4->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
      (peVar4->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
      ppwVar2 = &(peVar4->mtx).field_0.witness.link.qre_prev;
      *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
    }
    iVar6 = 4;
    do {
      peVar7 = duckdb_je_edata_avail_remove_first(&ecs->fallback->avail);
      if (peVar7 == (edata_t *)0x0) break;
      (peVar7->field_6).ql_link_inactive.qre_next = peVar7;
      (peVar7->field_6).ql_link_inactive.qre_prev = peVar7;
      peVar5 = (ecs->list).head.qlh_first;
      if (peVar5 != (edata_t *)0x0) {
        (peVar7->field_6).ql_link_inactive.qre_next = (peVar5->field_6).ql_link_inactive.qre_prev;
        (((ecs->list).head.qlh_first)->field_6).ql_link_inactive.qre_prev = peVar7;
        (peVar7->field_6).ql_link_inactive.qre_prev =
             (((peVar7->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next;
        peVar5 = (ecs->list).head.qlh_first;
        (((peVar5->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = peVar5;
        (((peVar7->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = peVar7;
        peVar7 = (peVar7->field_6).ql_link_inactive.qre_next;
      }
      (ecs->list).head.qlh_first = peVar7;
      paVar3 = &ecs->fallback->count;
      paVar3->repr = paVar3->repr - 1;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    peVar4 = ecs->fallback;
    (peVar4->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(peVar4->mtx).field_0 + 0x48));
    peVar7 = (ecs->list).head.qlh_first;
    if (peVar7 == (edata_t *)0x0) {
      peVar7 = duckdb_je_base_alloc_edata(tsdn,ecs->fallback->base);
      return peVar7;
    }
  }
  peVar5 = (peVar7->field_6).ql_link_inactive.qre_next;
  (ecs->list).head.qlh_first = peVar5;
  if (peVar5 == peVar7) {
    (ecs->list).head.qlh_first = (edata_t *)0x0;
  }
  else {
    (((peVar7->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next =
         (peVar5->field_6).ql_link_inactive.qre_prev;
    peVar5 = (peVar7->field_6).ql_link_inactive.qre_prev;
    (((peVar7->field_6).ql_link_inactive.qre_next)->field_6).ql_link_inactive.qre_prev = peVar5;
    (peVar7->field_6).ql_link_inactive.qre_prev = (peVar5->field_6).ql_link_inactive.qre_next;
    peVar5 = (peVar7->field_6).ql_link_inactive.qre_next;
    (((peVar5->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = peVar5;
    (((peVar7->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = peVar7;
  }
  return peVar7;
}

Assistant:

edata_t *
edata_cache_fast_get(tsdn_t *tsdn, edata_cache_fast_t *ecs) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_EDATA_CACHE, 0);

	if (ecs->disabled) {
		assert(edata_list_inactive_first(&ecs->list) == NULL);
		return edata_cache_get(tsdn, ecs->fallback);
	}

	edata_t *edata = edata_list_inactive_first(&ecs->list);
	if (edata != NULL) {
		edata_list_inactive_remove(&ecs->list, edata);
		return edata;
	}
	/* Slow path; requires synchronization. */
	edata_cache_fast_try_fill_from_fallback(tsdn, ecs);
	edata = edata_list_inactive_first(&ecs->list);
	if (edata != NULL) {
		edata_list_inactive_remove(&ecs->list, edata);
	} else {
		/*
		 * Slowest path (fallback was also empty); allocate something
		 * new.
		 */
		edata = base_alloc_edata(tsdn, ecs->fallback->base);
	}
	return edata;
}